

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O2

void __thiscall
TPZAnalysis::SetStructuralMatrix(TPZAnalysis *this,TPZAutoPointer<TPZStructMatrix> *strmatrix)

{
  TPZStructMatrix *obj;
  TPZAutoPointer<TPZStructMatrix> TStack_18;
  
  obj = (TPZStructMatrix *)(**(code **)(*(long *)strmatrix->fRef->fPointer + 0x48))();
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer(&TStack_18,obj);
  TPZAutoPointer<TPZStructMatrix>::operator=(&this->fStructMatrix,&TStack_18);
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer(&TStack_18);
  return;
}

Assistant:

void TPZAnalysis::SetStructuralMatrix(TPZAutoPointer<TPZStructMatrix> strmatrix){
	fStructMatrix = TPZAutoPointer<TPZStructMatrix>(strmatrix->Clone());
// #ifdef PZDEBUG
    auto* tmp =
        dynamic_cast<TPZStructMatrixT<STATE> *>((strmatrix.operator->()));
    if(tmp){//real struct matrix
        if(fCompMesh && fCompMesh->GetSolType() == EReal){
            return;
        }
    }else{//complex struct matrix
        if(fCompMesh && fCompMesh->GetSolType() == EComplex){
            return;
        }
    }
// #endif
}